

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult_p.h
# Opt level: O2

void __thiscall QSqlResultPrivate::~QSqlResultPrivate(QSqlResultPrivate *this)

{
  this->_vptr_QSqlResultPrivate = (_func_int **)&PTR__QSqlResultPrivate_0014d4e0;
  QArrayDataPointer<QHolder>::~QArrayDataPointer(&(this->holders).d);
  QHash<QString,_QList<int>_>::~QHash(&this->indexes);
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&(this->values).d);
  QHash<int,_QFlags<QSql::ParamTypeFlag>_>::~QHash(&this->types);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->executedQuery).d);
  QSqlError::~QSqlError(&this->error);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->sql).d);
  QWeakPointer<QObject>::~QWeakPointer(&(this->sqldriver).wp);
  return;
}

Assistant:

virtual ~QSqlResultPrivate() = default;